

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

type_of_iterator * __thiscall
roaring::Roaring64MapSetBitBiDirectionalIterator::operator++
          (Roaring64MapSetBitBiDirectionalIterator *this)

{
  bool bVar1;
  type_of_iterator *in_RDI;
  roaring_uint32_iterator_t *in_stack_ffffffffffffffd8;
  roaring_uint32_iterator_t *newit;
  _Self local_18 [3];
  
  if (((in_RDI->i).has_value & 1U) == 1) {
    roaring_uint32_iterator_advance(in_stack_ffffffffffffffd8);
  }
  while( true ) {
    if ((((in_RDI->i).has_value ^ 0xffU) & 1) == 0) {
      return in_RDI;
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)in_RDI);
    newit = (roaring_uint32_iterator_t *)&in_RDI->map_iter;
    local_18[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
         ::cend((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                 *)newit);
    bVar1 = std::operator==((_Self *)newit,local_18);
    if (bVar1) break;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x10cfb9
              );
    roaring_iterator_init((roaring_bitmap_t *)in_RDI,newit);
  }
  return in_RDI;
}

Assistant:

type_of_iterator &operator++() {  // ++i, must returned inc. value
        if (i.has_value == true) roaring_uint32_iterator_advance(&i);
        while (!i.has_value) {
            ++map_iter;
            if (map_iter == p->cend()) return *this;
            roaring_iterator_init(&map_iter->second.roaring, &i);
        }
        return *this;
    }